

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O2

void MPIX_NAPwait(NAPComm *nap_comm,NAPData *nap_data)

{
  int iVar1;
  int size;
  NAPCommData *pNVar2;
  NAPCommData *this;
  char *pcVar3;
  MPI_Datatype mpi_type;
  MPI_Request *send_requests;
  MPI_Request *recv_requests;
  comm_pkg *comm;
  char *pcVar4;
  MPI_Request *recv_requests_00;
  MPI_Request *send_requests_00;
  char *local_R_recv_data;
  MPI_Comm local_40;
  NAPCommData *local_38;
  
  pNVar2 = nap_data->send_data;
  this = nap_data->recv_data;
  local_40 = nap_data->mpi_comm;
  local_R_recv_data = (char *)0x0;
  pcVar3 = this->global_buffer;
  mpi_type = this->datatype;
  send_requests = nap_comm->send_requests;
  recv_requests = nap_comm->recv_requests;
  iVar1 = this->tag;
  MPIX_step_waitall(nap_comm->global_comm,send_requests,recv_requests);
  comm = nap_comm->local_L_comm;
  if (comm->send_data->num_msgs == 0) {
    send_requests_00 = (MPI_Request *)0x0;
  }
  else {
    send_requests_00 = send_requests + nap_comm->global_comm->send_data->num_msgs;
  }
  if (comm->recv_data->num_msgs == 0) {
    recv_requests_00 = (MPI_Request *)0x0;
  }
  else {
    recv_requests_00 = recv_requests + nap_comm->global_comm->recv_data->num_msgs;
  }
  MPIX_step_waitall(comm,send_requests_00,recv_requests_00);
  if (pNVar2->local_L_buffer != (char *)0x0) {
    operator_delete__(pNVar2->local_L_buffer);
    pNVar2->local_L_buffer = (char *)0x0;
  }
  pcVar4 = this->local_L_buffer;
  local_38 = pNVar2;
  if (pcVar4 != (char *)0x0) {
    MPIX_intra_recv_map(nap_comm->local_L_comm,pcVar4,this->buf,mpi_type,
                        nap_comm->topo_info->local_comm);
    operator_delete__(pcVar4);
    this->local_L_buffer = (char *)0x0;
  }
  size = nap_comm->global_comm->recv_data->size_msgs;
  if (size == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = MPIX_NAP_unpack(pcVar3,size,mpi_type,local_40);
  }
  MPIX_step_comm(nap_comm->local_R_comm,pcVar3,&local_R_recv_data,iVar1 + 2,
                 nap_comm->topo_info->local_comm,mpi_type,mpi_type,send_requests,recv_requests);
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
  }
  pcVar3 = local_R_recv_data;
  if (local_R_recv_data != (char *)0x0) {
    MPIX_intra_recv_map(nap_comm->local_R_comm,local_R_recv_data,this->buf,mpi_type,
                        nap_comm->topo_info->local_comm);
    operator_delete__(pcVar3);
  }
  pNVar2 = local_38;
  this->buf = (void *)0x0;
  NAPCommData::~NAPCommData(local_38);
  operator_delete(pNVar2);
  NAPCommData::~NAPCommData(this);
  operator_delete(this);
  return;
}

Assistant:

static void MPIX_NAPwait(NAPComm* nap_comm, NAPData* nap_data)
{
    NAPCommData* nap_send_data = nap_data->send_data;
    NAPCommData* nap_recv_data = nap_data->recv_data;
    MPI_Comm mpi_comm = nap_data->mpi_comm;

    char* local_R_recv_data = NULL;
    char* local_L_recv_data = nap_recv_data->local_L_buffer;
    char* global_send_buffer = nap_send_data->global_buffer;
    char* global_recv_buffer = nap_recv_data->global_buffer;
    MPI_Request* send_requests = nap_comm->send_requests;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_send_requests = NULL;
    MPI_Request* L_recv_requests = NULL;
    MPI_Datatype send_type = nap_send_data->datatype;
    MPI_Datatype recv_type = nap_recv_data->datatype;

    int local_R_tag = nap_recv_data->tag + 2;

    MPIX_step_waitall(nap_comm->global_comm, send_requests, recv_requests);
    if (nap_comm->local_L_comm->send_data->num_msgs)
        L_send_requests = &(send_requests[nap_comm->global_comm->send_data->num_msgs]);
    if (nap_comm->local_L_comm->recv_data->num_msgs)
        L_recv_requests = &(recv_requests[nap_comm->global_comm->recv_data->num_msgs]);
    MPIX_step_waitall(nap_comm->local_L_comm, L_send_requests, L_recv_requests);
    if (nap_send_data->local_L_buffer)
    {
        delete[] nap_send_data->local_L_buffer;
        nap_send_data->local_L_buffer = NULL;
    }

    // Map recv buffers from final intra node steps to correct locations in
    // recv_data
    local_L_recv_data = nap_recv_data->local_L_buffer;
    if (local_L_recv_data)
    {
        MPIX_intra_recv_map(nap_comm->local_L_comm, local_L_recv_data, nap_recv_data->buf,
                recv_type, nap_comm->topo_info->local_comm);
        delete[] local_L_recv_data;
        nap_recv_data->local_L_buffer = NULL;
    }

    // Final intra-node redistribution (step 3 in nap comm)
    // Unpack global_recv_buffer ot U[] (but don't know U here...)
    char* unpacked_buf = NULL;
    if (nap_comm->global_comm->recv_data->size_msgs)
    {
        // Unpack previous recv into void*
        unpacked_buf = MPIX_NAP_unpack(global_recv_buffer, 
                nap_comm->global_comm->recv_data->size_msgs,
                recv_type, mpi_comm);
    }

    // Initialize Isends for inter-node step (step 2 in nap comm)
    MPIX_step_comm(nap_comm->local_R_comm, global_recv_buffer, &local_R_recv_data,
            local_R_tag, nap_comm->topo_info->local_comm, recv_type, recv_type,
            send_requests, recv_requests);

    if (unpacked_buf)
        delete[] unpacked_buf;
    
    if (local_R_recv_data)
    {
        MPIX_intra_recv_map(nap_comm->local_R_comm, local_R_recv_data, nap_recv_data->buf,
                recv_type, nap_comm->topo_info->local_comm);
        delete[] local_R_recv_data;
    }
    nap_recv_data->buf = NULL;
    delete nap_send_data;
    delete nap_recv_data;
}